

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

int VP8InitFrame(VP8Decoder *dec,VP8Io *io)

{
  VP8FInfo *pVVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  WebPWorkerInterface *pWVar4;
  uint8_t *puVar5;
  VP8TopSamples *pVVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint8_t *puVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong nmemb;
  long lVar16;
  VP8FInfo *pVVar17;
  
  dec->cache_id = 0;
  if (dec->mt_method < 1) {
    uVar13 = 1;
    dec->num_caches = 1;
  }
  else {
    pWVar4 = WebPGetWorkerInterface();
    iVar3 = (*pWVar4->Reset)(&dec->worker);
    if (iVar3 == 0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"thread initialization failed.");
      if (iVar3 == 0) {
        return 0;
      }
      uVar13 = dec->num_caches;
    }
    else {
      (dec->worker).data1 = dec;
      (dec->worker).data2 = &(dec->thread_ctx).io;
      (dec->worker).hook = FinishRow;
      uVar13 = 0 < dec->filter_type | 2;
      dec->num_caches = uVar13;
    }
  }
  iVar3 = dec->mb_w;
  lVar8 = (long)iVar3;
  iVar11 = dec->filter_type;
  iVar9 = dec->mt_method;
  if ((long)iVar11 < 1) {
    lVar16 = 0;
  }
  else {
    lVar16 = (long)(iVar3 << (0 < iVar9)) << 2;
  }
  __n = lVar8 * 2 + 2;
  lVar15 = (long)(iVar3 << (iVar9 == 2)) * 800;
  bVar2 = ""[iVar11];
  lVar14 = (long)((int)((uVar13 * 0x10 + (uint)bVar2) * 3) / 2) * lVar8 * 0x20;
  if (dec->alpha_data == (uint8_t *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = (ulong)(dec->pic_hdr).height * (ulong)(dec->pic_hdr).width;
  }
  nmemb = lVar7 + lVar8 * 0x24 + __n + lVar16 + lVar15 + lVar14 + 0x35f;
  puVar5 = (uint8_t *)dec->mem;
  if (dec->mem_size < nmemb) {
    WebPSafeFree(puVar5);
    dec->mem_size = 0;
    puVar5 = (uint8_t *)WebPSafeMalloc(nmemb,1);
    dec->mem = puVar5;
    if (puVar5 == (uint8_t *)0x0) {
      iVar3 = VP8SetError(dec,VP8_STATUS_OUT_OF_MEMORY,"no memory during frame initialization.");
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00154371;
    }
    dec->mem_size = nmemb;
    iVar11 = dec->filter_type;
    iVar9 = dec->mt_method;
    bVar2 = ""[iVar11];
  }
  dec->intra_t = puVar5;
  pVVar6 = (VP8TopSamples *)(puVar5 + lVar8 * 4);
  dec->yuv_t = pVVar6;
  dec->mb_info = (VP8MB *)(pVVar6[lVar8].y + 2);
  pVVar1 = (VP8FInfo *)(pVVar6[lVar8].y + __n);
  pVVar17 = pVVar1;
  if (lVar16 == 0) {
    pVVar17 = (VP8FInfo *)0x0;
  }
  dec->f_info = pVVar17;
  (dec->thread_ctx).id = 0;
  lVar12 = 0;
  if (0 < iVar9) {
    lVar12 = lVar8;
  }
  if (iVar11 < 1) {
    lVar12 = 0;
  }
  (dec->thread_ctx).f_info = pVVar17 + lVar12;
  puVar5 = (uint8_t *)((ulong)(&pVVar1[7].hev_thresh + lVar16) & 0xffffffffffffffe0);
  dec->yuv_b = puVar5;
  dec->mb_data = (VP8MBData *)(puVar5 + 0x340);
  lVar16 = lVar8;
  if (iVar9 != 2) {
    lVar16 = 0;
  }
  (dec->thread_ctx).mb_data = (VP8MBData *)(puVar5 + lVar16 * 800 + 0x340);
  lVar15 = lVar15 + 0x340;
  iVar11 = iVar3 * 0x10;
  dec->cache_y_stride = iVar11;
  iVar3 = iVar3 * 8;
  dec->cache_uv_stride = iVar3;
  puVar10 = puVar5 + (int)(iVar11 * (uint)bVar2) + lVar15;
  dec->cache_y = puVar10;
  lVar16 = (long)(int)((uint)(bVar2 >> 1) * iVar3);
  dec->cache_u = puVar10 + (int)(iVar11 * uVar13 * 0x10) + lVar16;
  dec->cache_v = puVar10 + (int)(iVar11 * uVar13 * 0x10) + lVar16 +
                 (int)(uVar13 * iVar3 * 8) + lVar16;
  puVar5 = puVar5 + lVar14 + lVar15;
  dec->cache_id = 0;
  if (lVar7 == 0) {
    puVar5 = (uint8_t *)0x0;
  }
  dec->alpha_plane = puVar5;
  memset(pVVar6 + lVar8,0,__n);
  VP8InitScanline(dec);
  memset(dec->intra_t,0,lVar8 * 4);
LAB_00154371:
  io->mb_y = 0;
  puVar5 = dec->cache_u;
  io->y = dec->cache_y;
  io->u = puVar5;
  io->v = dec->cache_v;
  iVar3 = dec->cache_uv_stride;
  io->y_stride = dec->cache_y_stride;
  io->uv_stride = iVar3;
  io->a = (uint8_t *)0x0;
  VP8DspInit();
  return 1;
}

Assistant:

int VP8InitFrame(VP8Decoder* const dec, VP8Io* const io) {
  if (!InitThreadContext(dec)) return 0;  // call first. Sets dec->num_caches.
  if (!AllocateMemory(dec)) return 0;
  InitIo(dec, io);
  VP8DspInit();  // Init critical function pointers and look-up tables.
  return 1;
}